

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O2

Result wabt::ValidateModule(Module *module,Errors *errors,ValidateOptions *options)

{
  Result RVar1;
  Validator validator;
  Validator VStack_288;
  
  anon_unknown_4::Validator::Validator(&VStack_288,errors,module,options);
  RVar1 = anon_unknown_4::Validator::CheckModule(&VStack_288);
  anon_unknown_4::Validator::~Validator(&VStack_288);
  return (Result)RVar1.enum_;
}

Assistant:

Result ValidateModule(const Module* module,
                      Errors* errors,
                      const ValidateOptions& options) {
  Validator validator(errors, module, options);

  return validator.CheckModule();
}